

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O3

Result<wasm::Field> *
wasm::WATParser::anon_unknown_11::
fieldtype<wasm::WATParser::(anonymous_namespace)::ParseTypeDefsCtx>
          (Result<wasm::Field> *__return_storage_ptr__,ParseTypeDefsCtx *ctx)

{
  ParseInput *this;
  __index_type *p_Var1;
  undefined8 *puVar2;
  undefined1 *puVar3;
  _Uninitialized<wasm::Type,_true> _Var4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  Result<wasm::Field> *extraout_RAX;
  __index_type *p_Var9;
  undefined8 uVar10;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  undefined1 *local_e8;
  Type local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  string local_c8;
  undefined1 local_a8 [8];
  Result<wasm::Type> _val;
  Result<wasm::Type> type;
  Result<wasm::Field> field;
  
  this = &ctx->in;
  expected._M_str = "mut";
  expected._M_len = 3;
  bVar6 = ParseInput::takeSExprStart(this,expected);
  expected_00._M_str = "i8";
  expected_00._M_len = 2;
  bVar7 = ParseInput::takeKeyword(this,expected_00);
  if (bVar7) {
    field.val.super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err>._M_u._M_first._M_storage.type.id
         = (Type)1;
LAB_00a13c8d:
    type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_index = '\x02';
    type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._33_7_ = 0;
    field.val.super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err>._M_u._24_1_ = 0;
  }
  else {
    expected_01._M_str = "i16";
    expected_01._M_len = 3;
    bVar7 = ParseInput::takeKeyword(this,expected_01);
    if (bVar7) {
      field.val.super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err>._M_u._M_first._M_storage.type.
      id = (Type)2;
      goto LAB_00a13c8d;
    }
    p_Var1 = (__index_type *)
             ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20);
    valtype<wasm::WATParser::(anonymous_namespace)::ParseTypeDefsCtx>
              ((Result<wasm::Type> *)p_Var1,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::Err> *)local_a8,
                    (_Copy_ctor_base<false,_wasm::Type,_wasm::WATParser::Err> *)p_Var1);
    if (_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._24_1_ == '\x01') {
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,local_a8,
                 (undefined1 *)
                 ((long)_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                        super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._M_first
                        ._M_storage.id + (long)local_a8));
      type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._32_8_ =
           (long)&field.val.super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
                  super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                  super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                  super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                  super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err> + 8;
      if (local_e8 == local_d8) {
        field.val.super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err>._M_u._16_8_ = uStack_d0;
      }
      else {
        type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._32_8_ = local_e8;
      }
      field.val.super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err>._M_u._M_first._M_storage.type.
      id = (Type)(Type)local_e0.id;
      field.val.super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err>._M_u._24_1_ = 1;
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err> *)local_a8);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err> *)local_a8);
      type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_index =
           _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_index;
      type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._33_7_ =
           _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._33_7_;
      field.val.super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err>._M_u._M_first._M_storage.type.
      id = (Type)0;
      field.val.super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err>._M_u._24_1_ = 0;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::WATParser::Err> *)
                      ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                              super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20));
  }
  p_Var1 = (__index_type *)
           ((long)&type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Field,_wasm::WATParser::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Field,_wasm::WATParser::Err> *)
                  ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                          super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20),
                  (_Copy_ctor_base<false,_wasm::Field,_wasm::WATParser::Err> *)p_Var1);
  if (type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._24_1_ == '\x01') {
    _Var4._M_storage.id =
         (Type)((long)&_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 8);
    local_a8 = (undefined1  [8])_Var4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,
               _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._32_8_,
               (long)type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._M_first.
                     _M_storage.id +
               _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._32_8_);
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> = puVar2;
    if ((Type)local_a8 == _Var4._M_storage.id) {
      *puVar2 = _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._8_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> + 0x18) =
           _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> = local_a8;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> + 0x10) =
           _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._8_8_;
    }
    ((_Uninitialized<wasm::Type,_true> *)
    ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
            super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
            super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
            super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
            super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> + 8))->_M_storage =
         (Type)_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._M_first.
               _M_storage.id;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> + 0x20) = '\x01';
    std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Field,_wasm::WATParser::Err> *)
                      ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                              super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20));
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Field,_wasm::WATParser::Err> *)
                      ((long)&_val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                              super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                              super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20));
    if (bVar6) {
      bVar6 = ParseInput::takeRParen(this);
      if (!bVar6) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"expected end of field type","");
        ParseInput::err((Err *)((long)&_val.val.
                                       super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                                       super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                                       super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                                       super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                                       super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> +
                               0x20),this,&local_c8);
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                         super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
          super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
          super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
          super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
          super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
          super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> = puVar2;
        puVar3 = (undefined1 *)
                 ((long)&type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 8);
        if ((undefined1 *)
            _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
            super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
            super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
            super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
            super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._32_8_ == puVar3) {
          *puVar2 = CONCAT71(type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                             super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                             super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                             super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                             super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                             super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u.
                             _9_7_,type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                                   super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                                   super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                                   super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                                   super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                                   super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>.
                                   _M_u._8_1_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> + 0x18) =
               type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._16_8_;
        }
        else {
          *(undefined8 *)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
            super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
            super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
            super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
            super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
            super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> =
               _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._32_8_;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
                            super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                            super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                            super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                            super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                            super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> + 0x10)
               = CONCAT71(type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                          super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._9_7_,
                          type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                          super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                          super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._8_1_)
          ;
        }
        ((_Uninitialized<wasm::Type,_true> *)
        ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::WATParser::Err>
                .super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> + 8))->_M_storage =
             (Type)type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._M_first.
                   _M_storage.id;
        type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._M_first._M_storage.id =
             (_Uninitialized<wasm::Type,_true>)(Type)0x0;
        type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._M_u._8_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
                 super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                 super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                 super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                 super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                 super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> + 0x20) = '\x01';
        _val.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._32_8_ = puVar3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00a13e23;
      }
      uVar8 = 0x100000000;
    }
    else {
      uVar8 = 0;
    }
    p_Var9 = (__index_type *)0x0;
    if (field.val.super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err>._M_u._24_1_ == '\0') {
      p_Var9 = p_Var1;
    }
    uVar5 = *(uint *)(p_Var9 + 8);
    uVar10._0_1_ = '\x02';
    uVar10._1_7_ = 0;
    if ((ulong)uVar5 == 0) {
      uVar10 = type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::WATParser::Err>._32_8_;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> = uVar10;
    *(ulong *)((long)&(__return_storage_ptr__->val).
                      super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> + 8) =
         uVar5 | uVar8;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Field,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::Field,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::Field,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::Field,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::Field,_wasm::WATParser::Err> + 0x20) = '\0';
  }
LAB_00a13e23:
  std::__detail::__variant::_Variant_storage<false,_wasm::Field,_wasm::WATParser::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Field,_wasm::WATParser::Err> *)
                    ((long)&type.val.super__Variant_base<wasm::Type,_wasm::WATParser::Err>.
                            super__Move_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                            super__Copy_assign_alias<wasm::Type,_wasm::WATParser::Err>.
                            super__Move_ctor_alias<wasm::Type,_wasm::WATParser::Err>.
                            super__Copy_ctor_alias<wasm::Type,_wasm::WATParser::Err> + 0x20));
  return extraout_RAX;
}

Assistant:

Result<typename Ctx::FieldT> fieldtype(Ctx& ctx) {
  auto mutability = Immutable;
  if (ctx.in.takeSExprStart("mut"sv)) {
    mutability = Mutable;
  }

  auto field = storagetype(ctx);
  CHECK_ERR(field);

  if (mutability == Mutable) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of field type");
    }
  }

  return ctx.makeFieldType(*field, mutability);
}